

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backed_block.cpp
# Opt level: O0

void backed_block_list_destroy(backed_block_list *bbl)

{
  long *in_RDI;
  backed_block *next;
  backed_block *bb;
  undefined8 local_10;
  
  if (*in_RDI != 0) {
    local_10 = *in_RDI;
    while (local_10 != 0) {
      local_10 = *(long *)(local_10 + 0x20);
      backed_block_destroy((backed_block *)0x104950);
    }
  }
  free(in_RDI);
  return;
}

Assistant:

void backed_block_list_destroy(struct backed_block_list* bbl) {
  if (bbl->data_blocks) {
    struct backed_block* bb = bbl->data_blocks;
    while (bb) {
      struct backed_block* next = bb->next;
      backed_block_destroy(bb);
      bb = next;
    }
  }

  free(bbl);
}